

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O0

void __thiscall kj::_::Mutex::unlock(Mutex *this,Exclusivity exclusivity)

{
  uint uVar1;
  Waiter *other;
  ulong uVar2;
  bool bVar3;
  ulong in_stack_ffffffffffffff68;
  uint local_7c;
  uint state;
  Fault f_1;
  uint oldState;
  Waiter *waiter;
  Maybe<kj::_::Mutex::Waiter_&> nextWaiter;
  Fault local_20;
  Fault f;
  Exclusivity exclusivity_local;
  Mutex *this_local;
  
  f.exception._4_4_ = exclusivity;
  if (exclusivity == EXCLUSIVE) {
    if ((this->futex & 0x80000000) == 0) {
      Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37]>
                (&local_20,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/mutex.c++"
                 ,0x76,FAILED,"futex & EXCLUSIVE_HELD","\"Unlocked a mutex that wasn\'t locked.\"",
                 (char (*) [37])"Unlocked a mutex that wasn\'t locked.");
      Debug::Fault::fatal(&local_20);
    }
    Maybe<kj::_::Mutex::Waiter_&>::Maybe<kj::_::Mutex::Waiter>
              ((Maybe<kj::_::Mutex::Waiter_&> *)&waiter,&this->waitersHead);
    do {
      other = readMaybe<kj::_::Mutex::Waiter>((Maybe<kj::_::Mutex::Waiter_&> *)&waiter);
      if (other == (Waiter *)0x0) {
        f_1.exception._4_4_ = 0x3fffffff;
        local_7c = this->futex;
        do {
          LOCK();
          f_1.exception._0_4_ = this->futex;
          bVar3 = local_7c == (uint)f_1.exception;
          if (bVar3) {
            this->futex = local_7c & 0x3fffffff;
            f_1.exception._0_4_ = local_7c;
          }
          UNLOCK();
          local_7c = (uint)f_1.exception;
        } while (!bVar3);
        if (((uint)f_1.exception & 0x7fffffff) == 0) {
          return;
        }
        syscall(0xca,this,0x81,0x7fffffff,0,0,in_stack_ffffffffffffff68 & 0xffffffff00000000);
        return;
      }
      Maybe<kj::_::Mutex::Waiter&>::operator=((Maybe<kj::_::Mutex::Waiter&> *)&waiter,&other->next);
      uVar2 = (*(code *)**(undefined8 **)other->predicate)();
    } while ((uVar2 & 1) == 0);
    other->futex = 1;
    syscall(0xca,&other->futex,0x81,0x7fffffff,0,0,in_stack_ffffffffffffff68 & 0xffffffff00000000);
  }
  else if (exclusivity == SHARED) {
    if ((this->futex & 0x3fffffff) == 0) {
      Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37]>
                ((Fault *)&stack0xffffffffffffffa8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/mutex.c++"
                 ,0x9c,FAILED,"futex & SHARED_COUNT_MASK",
                 "\"Unshared a mutex that wasn\'t shared.\"",
                 (char (*) [37])"Unshared a mutex that wasn\'t shared.");
      Debug::Fault::fatal((Fault *)&stack0xffffffffffffffa8);
    }
    LOCK();
    uVar1 = this->futex;
    this->futex = this->futex - 1;
    UNLOCK();
    if (uVar1 == 0x40000001) {
      LOCK();
      bVar3 = this->futex == 0x40000000;
      if (bVar3) {
        this->futex = 0;
      }
      UNLOCK();
      if (bVar3) {
        syscall(0xca,this,0x81,0x7fffffff,0,0,in_stack_ffffffffffffff68 & 0xffffffff00000000);
      }
    }
  }
  return;
}

Assistant:

void Mutex::unlock(Exclusivity exclusivity) {
  switch (exclusivity) {
    case EXCLUSIVE: {
      KJ_DASSERT(futex & EXCLUSIVE_HELD, "Unlocked a mutex that wasn't locked.");

      // First check if there are any conditional waiters. Note we only do this when unlocking an
      // exclusive lock since under a shared lock the state couldn't have changed.
      auto nextWaiter = waitersHead;
      for (;;) {
        KJ_IF_MAYBE(waiter, nextWaiter) {
          nextWaiter = waiter->next;

          if (waiter->predicate.check()) {
            // This waiter's predicate now evaluates true, so wake it up.
            __atomic_store_n(&waiter->futex, 1, __ATOMIC_RELEASE);
            syscall(SYS_futex, &waiter->futex, FUTEX_WAKE_PRIVATE, INT_MAX, NULL, NULL, 0);

            // We transferred ownership of the lock to this waiter, so we're done now.
            return;
          }
        } else {
          // No more waiters.
          break;
        }
      }

      // Didn't wake any waiters, so wake normally.
      uint oldState = __atomic_fetch_and(
          &futex, ~(EXCLUSIVE_HELD | EXCLUSIVE_REQUESTED), __ATOMIC_RELEASE);

      if (KJ_UNLIKELY(oldState & ~EXCLUSIVE_HELD)) {
        // Other threads are waiting.  If there are any shared waiters, they now collectively hold
        // the lock, and we must wake them up.  If there are any exclusive waiters, we must wake
        // them up even if readers are waiting so that at the very least they may re-establish the
        // EXCLUSIVE_REQUESTED bit that we just removed.
        syscall(SYS_futex, &futex, FUTEX_WAKE_PRIVATE, INT_MAX, NULL, NULL, 0);
      }
      break;
    }

    case SHARED: {
      KJ_DASSERT(futex & SHARED_COUNT_MASK, "Unshared a mutex that wasn't shared.");
      uint state = __atomic_sub_fetch(&futex, 1, __ATOMIC_RELEASE);

      // The only case where anyone is waiting is if EXCLUSIVE_REQUESTED is set, and the only time
      // it makes sense to wake up that waiter is if the shared count has reached zero.
      if (KJ_UNLIKELY(state == EXCLUSIVE_REQUESTED)) {
        if (__atomic_compare_exchange_n(
            &futex, &state, 0, false, __ATOMIC_RELAXED, __ATOMIC_RELAXED)) {
          // Wake all exclusive waiters.  We have to wake all of them because one of them will
          // grab the lock while the others will re-establish the exclusive-requested bit.
          syscall(SYS_futex, &futex, FUTEX_WAKE_PRIVATE, INT_MAX, NULL, NULL, 0);
        }
      }
      break;
    }
  }